

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void addlenmod(char *form,char *lenmod)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char spec;
  size_t lm;
  size_t l;
  char *lenmod_local;
  char *form_local;
  
  sVar2 = strlen(form);
  sVar3 = strlen(lenmod);
  cVar1 = form[sVar2 - 1];
  strcpy(form + (sVar2 - 1),lenmod);
  form[sVar2 + sVar3 + -1] = cVar1;
  form[sVar2 + sVar3] = '\0';
  return;
}

Assistant:

static void addlenmod(char *form, const char *lenmod) {
    size_t l = strlen(form);
    size_t lm = strlen(lenmod);
    char spec = form[l - 1];
    strcpy(form + l - 1, lenmod);
    form[l + lm - 1] = spec;
    form[l + lm] = '\0';
}